

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/ItemSimilarityRecommender.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  ItemSimilarityRecommender_ConnectedItem::ItemSimilarityRecommender_ConnectedItem
            ((ItemSimilarityRecommender_ConnectedItem *)
             &_ItemSimilarityRecommender_ConnectedItem_default_instance_);
  DAT_003e3dd0 = 1;
  ItemSimilarityRecommender_SimilarItems::ItemSimilarityRecommender_SimilarItems
            ((ItemSimilarityRecommender_SimilarItems *)
             &_ItemSimilarityRecommender_SimilarItems_default_instance_);
  DAT_003e3e18 = 1;
  ItemSimilarityRecommender::ItemSimilarityRecommender
            ((ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_);
  DAT_003e3e90 = 1;
  DAT_003e3e78 = &_StringVector_default_instance_;
  DAT_003e3e80 = &_Int64Vector_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _ItemSimilarityRecommender_ConnectedItem_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_SimilarItems_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_default_instance_.DefaultConstruct();
  _ItemSimilarityRecommender_default_instance_.get_mutable()->itemstringids_ = const_cast< ::CoreML::Specification::StringVector*>(
      ::CoreML::Specification::StringVector::internal_default_instance());
  _ItemSimilarityRecommender_default_instance_.get_mutable()->itemint64ids_ = const_cast< ::CoreML::Specification::Int64Vector*>(
      ::CoreML::Specification::Int64Vector::internal_default_instance());
}